

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Type_create_subarray
              (int ndims,int *array_of_sizes,int *array_of_subsizes,int *array_of_starts,int ordder,
              MPIABI_Datatype oldtype,MPIABI_Datatype *newtype)

{
  int iVar1;
  
  iVar1 = MPI_Type_create_subarray();
  return iVar1;
}

Assistant:

int MPIABI_Type_create_subarray(
  int ndims,
  const int * array_of_sizes,
  const int * array_of_subsizes,
  const int * array_of_starts,
  int ordder,
  MPIABI_Datatype oldtype,
  MPIABI_Datatype * newtype
) {
  return MPI_Type_create_subarray(
    ndims,
    array_of_sizes,
    array_of_subsizes,
    array_of_starts,
    ordder,
    (MPI_Datatype)(WPI_Datatype)oldtype,
    (MPI_Datatype *)(WPI_DatatypePtr)newtype
  );
}